

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O0

void new_anything(void *dummy,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  _glist *canvas;
  char *nameptr;
  char classslashclass [1000];
  char dirbuf [1000];
  int fd;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  void *dummy_local;
  
  if (tryingalready < 0x3e9) {
    if (s == &s_anything) {
      pd_error((void *)0x0,"object name \"%s\" not allowed",s_anything.s_name);
    }
    else {
      pd_maininstance.pd_newest = (t_pd *)0x0;
      class_loadsym = s;
      pd_globallock();
      canvas = canvas_getcurrent();
      iVar1 = sys_load_lib(canvas,s->s_name);
      if (iVar1 == 0) {
        class_loadsym = (t_symbol *)0x0;
        pd_globalunlock();
      }
      else {
        tryingalready = tryingalready + 1;
        pd_typedmess((t_pd *)dummy,s,argc,argv);
        tryingalready = tryingalready + -1;
      }
    }
  }
  else {
    pd_error((void *)0x0,"maximum object loading depth %d reached",1000);
  }
  return;
}

Assistant:

void new_anything(void *dummy, t_symbol *s, int argc, t_atom *argv)
{
    int fd;
    char dirbuf[MAXPDSTRING], classslashclass[MAXPDSTRING], *nameptr;
    if (tryingalready>MAXOBJDEPTH){
      pd_error(0, "maximum object loading depth %d reached", MAXOBJDEPTH);
      return;
    }
    if (s == &s_anything){
      pd_error(0, "object name \"%s\" not allowed", s->s_name);
      return;
    }
    pd_this->pd_newest = 0;
    class_loadsym = s;
    pd_globallock();
    if (sys_load_lib(canvas_getcurrent(), s->s_name))
    {
        tryingalready++;
        typedmess(dummy, s, argc, argv);
        tryingalready--;
        return;
    }
    class_loadsym = 0;
    pd_globalunlock();
}